

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Bmc_MnaBuild_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew,Vec_Int_t *vMap,Vec_Int_t *vPiMap
                     )

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int local_38;
  int local_34;
  int iLit1;
  int iLit0;
  Vec_Int_t *vPiMap_local;
  Vec_Int_t *vMap_local;
  Gia_Man_t *pNew_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (*(long *)pObj < 0) {
    *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff;
    if (pObj->Value != 3) {
      __assert_fail("pObj->Value == GIA_UND",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                    ,0xe9,
                    "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsRo(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsPi(p,pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                        ,0xfe,
                        "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar1 = Gia_ObjCioId(pObj);
        Vec_IntPush(vPiMap,iVar1);
        iVar1 = Gia_ObjId(p,pObj);
        iVar2 = Gia_ManAppendCi(pNew);
        Vec_IntWriteEntry(vMap,iVar1,iVar2);
      }
      else {
        iVar1 = Gia_ObjId(p,pObj);
        iVar1 = Vec_IntEntry(vMap,iVar1);
        if (iVar1 == -1) {
          __assert_fail("Vec_IntEntry(vMap, Gia_ObjId(p, pObj)) != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                        ,0xf8,
                        "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
      }
    }
    else {
      local_34 = 1;
      local_38 = 1;
      pGVar3 = Gia_ObjFanin0(pObj);
      if (pGVar3->Value == 3) {
        pGVar3 = Gia_ObjFanin0(pObj);
        Bmc_MnaBuild_rec(p,pGVar3,pNew,vMap,vPiMap);
      }
      pGVar3 = Gia_ObjFanin1(pObj);
      if (pGVar3->Value == 3) {
        pGVar3 = Gia_ObjFanin1(pObj);
        Bmc_MnaBuild_rec(p,pGVar3,pNew,vMap,vPiMap);
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      if (pGVar3->Value == 3) {
        iVar1 = Gia_ObjFaninId0p(p,pObj);
        iVar1 = Vec_IntEntry(vMap,iVar1);
        iVar2 = Gia_ObjFaninC0(pObj);
        local_34 = Abc_LitNotCond(iVar1,iVar2);
      }
      pGVar3 = Gia_ObjFanin1(pObj);
      if (pGVar3->Value == 3) {
        iVar1 = Gia_ObjFaninId1p(p,pObj);
        iVar1 = Vec_IntEntry(vMap,iVar1);
        iVar2 = Gia_ObjFaninC1(pObj);
        local_38 = Abc_LitNotCond(iVar1,iVar2);
      }
      iVar1 = Gia_ObjId(p,pObj);
      iVar2 = Gia_ManHashAnd(pNew,local_34,local_38);
      Vec_IntWriteEntry(vMap,iVar1,iVar2);
    }
  }
  return;
}

Assistant:

void Bmc_MnaBuild_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew, Vec_Int_t * vMap, Vec_Int_t * vPiMap )
{
    if ( !pObj->fPhase )
        return;
    pObj->fPhase = 0;
    assert( pObj->Value == GIA_UND );
    if ( Gia_ObjIsAnd(pObj) )
    {
        int iLit0 = 1, iLit1 = 1;
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            Bmc_MnaBuild_rec( p, Gia_ObjFanin0(pObj), pNew, vMap, vPiMap );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            Bmc_MnaBuild_rec( p, Gia_ObjFanin1(pObj), pNew, vMap, vPiMap );
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            iLit0 = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId0p(p, pObj)), Gia_ObjFaninC0(pObj) );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            iLit1 = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId1p(p, pObj)), Gia_ObjFaninC1(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), Gia_ManHashAnd(pNew, iLit0, iLit1) );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        assert( Vec_IntEntry(vMap, Gia_ObjId(p, pObj)) != -1 );
    else if ( Gia_ObjIsPi(p, pObj) )
    {
        Vec_IntPush( vPiMap, Gia_ObjCioId(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), Gia_ManAppendCi(pNew) );
    }
    else assert( 0 );
}